

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlStatus htmlNodeStatus(htmlNodePtr node,int legacy)

{
  int iVar1;
  htmlElemDesc *elt;
  htmlElemDesc *phVar2;
  htmlStatus local_24;
  int legacy_local;
  htmlNodePtr node_local;
  
  if (node == (htmlNodePtr)0x0) {
    node_local._4_4_ = HTML_INVALID;
  }
  else if (node->type == XML_ELEMENT_NODE) {
    if (legacy == 0) {
      phVar2 = htmlTagLookup(node->parent->name);
      elt = htmlTagLookup(node->name);
      local_24 = htmlElementStatusHere(phVar2,elt);
    }
    else {
      phVar2 = htmlTagLookup(node->parent->name);
      iVar1 = htmlElementAllowedHere(phVar2,node->name);
      local_24 = HTML_INVALID;
      if (iVar1 != 0) {
        local_24 = HTML_VALID;
      }
    }
    node_local._4_4_ = local_24;
  }
  else if (node->type == XML_ATTRIBUTE_NODE) {
    phVar2 = htmlTagLookup(node->parent->name);
    node_local._4_4_ = htmlAttrAllowed(phVar2,node->name,legacy);
  }
  else {
    node_local._4_4_ = HTML_NA;
  }
  return node_local._4_4_;
}

Assistant:

htmlStatus
htmlNodeStatus(const htmlNodePtr node, int legacy) {
  if ( ! node )
    return HTML_INVALID ;

  switch ( node->type ) {
    case XML_ELEMENT_NODE:
      return legacy
	? ( htmlElementAllowedHere (
		htmlTagLookup(node->parent->name) , node->name
		) ? HTML_VALID : HTML_INVALID )
	: htmlElementStatusHere(
		htmlTagLookup(node->parent->name) ,
		htmlTagLookup(node->name) )
	;
    case XML_ATTRIBUTE_NODE:
      return htmlAttrAllowed(
	htmlTagLookup(node->parent->name) , node->name, legacy) ;
    default: return HTML_NA ;
  }
}